

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O3

ArchKind llvm::ARM::parseArch(StringRef Arch)

{
  int iVar1;
  size_t in_RDX;
  ulong __n;
  long lVar2;
  StringRef SVar3;
  
  SVar3.Data = (char *)Arch.Length;
  SVar3.Length = in_RDX;
  SVar3 = getCanonicalArchName((ARM *)Arch.Data,SVar3);
  SVar3 = getArchSynonym(SVar3);
  __n = SVar3.Length;
  lVar2 = 0;
  while ((*(ulong *)(&DAT_00251f78 + lVar2) < __n ||
         ((__n != 0 &&
          (iVar1 = bcmp((void *)((*(ulong *)(&DAT_00251f78 + lVar2) +
                                 *(long *)((long)&(anonymous_namespace)::ARCHNames + lVar2)) - __n),
                        SVar3.Data,__n), iVar1 != 0))))) {
    lVar2 = lVar2 + 0x40;
    if (lVar2 == 0x840) {
      return INVALID;
    }
  }
  return *(ArchKind *)((long)&DAT_00251fa8 + lVar2);
}

Assistant:

ARM::ArchKind ARM::parseArch(StringRef Arch) {
  Arch = getCanonicalArchName(Arch);
  StringRef Syn = getArchSynonym(Arch);
  for (const auto A : ARCHNames) {
    if (A.getName().endswith(Syn))
      return A.ID;
  }
  return ARM::ArchKind::INVALID;
}